

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

DSA_SIG * DSA_do_sign(uchar *dgst,int dlen,DSA *dsa)

{
  long lVar1;
  DSA *pDVar2;
  int iVar3;
  uint uVar4;
  BIGNUM *a;
  BIGNUM *pBVar5;
  size_t words;
  undefined4 in_register_00000034;
  size_t q_width;
  DSA_SIG *pDStack_80;
  int iters;
  DSA_SIG *ret;
  BN_CTX *ctx;
  BIGNUM xr;
  BIGNUM m;
  BIGNUM *s;
  BIGNUM *r;
  BIGNUM *kinv;
  DSA *dsa_local;
  size_t digest_len_local;
  uint8_t *digest_local;
  
  dsa_local = (DSA *)CONCAT44(in_register_00000034,dlen);
  kinv = (BIGNUM *)dsa;
  digest_len_local = (size_t)dgst;
  iVar3 = dsa_check_key((DSA *)dsa);
  if (iVar3 == 0) {
    digest_local = (uint8_t *)0x0;
  }
  else {
    lVar1._0_4_ = kinv[1].width;
    lVar1._4_4_ = kinv[1].dmax;
    if (lVar1 == 0) {
      ERR_put_error(10,0,0x65,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                    ,0x217);
      digest_local = (uint8_t *)0x0;
    }
    else {
      r = (BIGNUM *)0x0;
      s = (BIGNUM *)0x0;
      ret = (DSA_SIG *)0x0;
      pDStack_80 = (DSA_SIG *)0x0;
      BN_init((BIGNUM *)&xr.neg);
      BN_init((BIGNUM *)&ctx);
      a = BN_new();
      if ((a != (BIGNUM *)0x0) && (ret = (DSA_SIG *)BN_CTX_new(), (BN_CTX *)ret != (BN_CTX *)0x0)) {
        q_width._4_4_ = 0;
        do {
          iVar3 = dsa_sign_setup((DSA *)kinv,(BN_CTX *)ret,&r,&s);
          pDVar2 = dsa_local;
          if (iVar3 == 0) goto LAB_002db01b;
          uVar4 = BN_num_bytes(*(BIGNUM **)&kinv->width);
          if ((DSA *)(ulong)uVar4 < pDVar2) {
            uVar4 = BN_num_bytes(*(BIGNUM **)&kinv->width);
            dsa_local = (DSA *)(ulong)uVar4;
          }
          pBVar5 = BN_bin2bn((uchar *)digest_len_local,(int)dsa_local,(BIGNUM *)&xr.neg);
          if (pBVar5 == (BIGNUM *)0x0) goto LAB_002db01b;
          iVar3 = bn_minimal_width(*(BIGNUM **)&kinv->width);
          words = (size_t)iVar3;
          iVar3 = bn_resize_words((BIGNUM *)&xr.neg,words);
          if ((iVar3 == 0) || (iVar3 = bn_resize_words((BIGNUM *)&ctx,words), iVar3 == 0))
          goto LAB_002db01b;
          bn_reduce_once_in_place
                    ((BN_ULONG *)xr._16_8_,0,(BN_ULONG *)**(undefined8 **)&kinv->width,
                     (BN_ULONG *)ctx,words);
          iVar3 = mod_mul_consttime((BIGNUM *)&ctx,*(BIGNUM **)&kinv[1].width,s,
                                    *(BN_MONT_CTX **)&kinv[4].width,(BN_CTX *)ret);
          if ((iVar3 == 0) ||
             ((iVar3 = bn_mod_add_consttime
                                 ((BIGNUM *)a,(BIGNUM *)&ctx,(BIGNUM *)&xr.neg,
                                  *(BIGNUM **)&kinv->width,(BN_CTX *)ret), iVar3 == 0 ||
              (iVar3 = mod_mul_consttime((BIGNUM *)a,(BIGNUM *)a,r,*(BN_MONT_CTX **)&kinv[4].width,
                                         (BN_CTX *)ret), iVar3 == 0)))) goto LAB_002db01b;
          bn_declassify(s);
          bn_declassify((BIGNUM *)a);
          iVar3 = BN_is_zero(s);
          if ((iVar3 == 0) && (iVar3 = BN_is_zero((BIGNUM *)a), iVar3 == 0)) {
            pDStack_80 = DSA_SIG_new();
            if (pDStack_80 != (DSA_SIG *)0x0) {
              pDStack_80->r = (BIGNUM *)s;
              pDStack_80->s = a;
            }
            goto LAB_002db01b;
          }
          q_width._4_4_ = q_width._4_4_ + 1;
        } while (q_width._4_4_ < 0x21);
        ERR_put_error(10,0,0x6c,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                      ,0x261);
      }
LAB_002db01b:
      if (pDStack_80 == (DSA_SIG *)0x0) {
        ERR_put_error(10,0,3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                      ,0x271);
        BN_free((BIGNUM *)s);
        BN_free(a);
      }
      BN_CTX_free((BN_CTX *)ret);
      BN_clear_free((BIGNUM *)&xr.neg);
      BN_clear_free((BIGNUM *)&ctx);
      BN_clear_free((BIGNUM *)r);
      digest_local = (uint8_t *)pDStack_80;
    }
  }
  return (DSA_SIG *)digest_local;
}

Assistant:

DSA_SIG *DSA_do_sign(const uint8_t *digest, size_t digest_len, const DSA *dsa) {
  if (!dsa_check_key(dsa)) {
    return NULL;
  }

  if (dsa->priv_key == NULL) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_MISSING_PARAMETERS);
    return NULL;
  }

  BIGNUM *kinv = NULL, *r = NULL, *s = NULL;
  BIGNUM m;
  BIGNUM xr;
  BN_CTX *ctx = NULL;
  DSA_SIG *ret = NULL;

  BN_init(&m);
  BN_init(&xr);
  s = BN_new();
  {
    if (s == NULL) {
      goto err;
    }
    ctx = BN_CTX_new();
    if (ctx == NULL) {
      goto err;
    }

    // Cap iterations so that invalid parameters do not infinite loop. This does
    // not impact valid parameters because the probability of requiring even one
    // retry is negligible, let alone 32. Unfortunately, DSA was mis-specified,
    // so invalid parameters are reachable from most callers handling untrusted
    // private keys. (The |dsa_check_key| call above is not sufficient. Checking
    // whether arbitrary paremeters form a valid DSA group is expensive.)
    static const int kMaxIterations = 32;
    int iters = 0;
  redo:
    if (!dsa_sign_setup(dsa, ctx, &kinv, &r)) {
      goto err;
    }

    if (digest_len > BN_num_bytes(dsa->q)) {
      // If the digest length is greater than the size of |dsa->q| use the
      // BN_num_bits(dsa->q) leftmost bits of the digest, see FIPS 186-3, 4.2.
      // Note the above check that |dsa->q| is a multiple of 8 bits.
      digest_len = BN_num_bytes(dsa->q);
    }

    if (BN_bin2bn(digest, digest_len, &m) == NULL) {
      goto err;
    }

    // |m| is bounded by 2^(num_bits(q)), which is slightly looser than q. This
    // violates |bn_mod_add_consttime| and |mod_mul_consttime|'s preconditions.
    // (The underlying algorithms could accept looser bounds, but we reduce for
    // simplicity.)
    size_t q_width = bn_minimal_width(dsa->q);
    if (!bn_resize_words(&m, q_width) || !bn_resize_words(&xr, q_width)) {
      goto err;
    }
    bn_reduce_once_in_place(m.d, 0 /* no carry word */, dsa->q->d,
                            xr.d /* scratch space */, q_width);

    // Compute s = inv(k) (m + xr) mod q. Note |dsa->method_mont_q| is
    // initialized by |dsa_sign_setup|.
    if (!mod_mul_consttime(&xr, dsa->priv_key, r, dsa->method_mont_q, ctx) ||
        !bn_mod_add_consttime(s, &xr, &m, dsa->q, ctx) ||
        !mod_mul_consttime(s, s, kinv, dsa->method_mont_q, ctx)) {
      goto err;
    }

    // The signature is computed from the private key, but is public.
    bn_declassify(r);
    bn_declassify(s);

    // Redo if r or s is zero as required by FIPS 186-3: this is
    // very unlikely.
    if (BN_is_zero(r) || BN_is_zero(s)) {
      iters++;
      if (iters > kMaxIterations) {
        OPENSSL_PUT_ERROR(DSA, DSA_R_TOO_MANY_ITERATIONS);
        goto err;
      }
      goto redo;
    }

    ret = DSA_SIG_new();
    if (ret == NULL) {
      goto err;
    }
    ret->r = r;
    ret->s = s;
  }

err:
  if (ret == NULL) {
    OPENSSL_PUT_ERROR(DSA, ERR_R_BN_LIB);
    BN_free(r);
    BN_free(s);
  }
  BN_CTX_free(ctx);
  BN_clear_free(&m);
  BN_clear_free(&xr);
  BN_clear_free(kinv);

  return ret;
}